

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SpanTest_CtorFromPtrAndSize_Test::TestBody
          (SpanTest_CtorFromPtrAndSize_Test *this)

{
  initializer_list<int> __l;
  int *piVar1;
  size_type len;
  int *ptr;
  size_t in_R8;
  Span<int> s_00;
  undefined1 auStack_70 [8];
  Span<int> s;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> v;
  SpanTest_CtorFromPtrAndSize_Test *this_local;
  
  local_48[0] = 7;
  local_48[1] = 8;
  local_48[2] = 9;
  local_48[3] = 10;
  local_38 = local_48;
  local_30 = 4;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  len = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)local_28);
  Span<int>::Span((Span<int> *)auStack_70,piVar1,len);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  ptr = (int *)std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)local_28);
  s_00.size_ = (size_t)piVar1;
  s_00.data_ = s.data_;
  TestCtor((anon_unknown_0 *)auStack_70,s_00,ptr,in_R8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(SpanTest, CtorFromPtrAndSize) {
  std::vector<int> v = {7, 8, 9, 10};
  Span<int> s(v.data(), v.size());
  TestCtor(s, v.data(), v.size());
}